

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int properties_set_to(PROPERTIES_HANDLE properties,AMQP_VALUE to_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    iVar2 = 0x3f6e;
  }
  else {
    iVar2 = 0x3f7e;
    if (to_value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_clone(to_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(properties->composite_value,2,item_value);
        iVar2 = 0x3f84;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int properties_set_to(PROPERTIES_HANDLE properties, AMQP_VALUE to_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE to_amqp_value;
        if (to_value == NULL)
        {
            to_amqp_value = NULL;
        }
        else
        {
            to_amqp_value = amqpvalue_clone(to_value);
        }
        if (to_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 2, to_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(to_amqp_value);
        }
    }

    return result;
}